

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_suite.cpp
# Opt level: O0

void enum_class_suite::to_enum(void)

{
  enumeration eVar1;
  undefined1 local_38 [4];
  enumeration result;
  variable input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,0x2a);
  eVar1 = trial::dynamic::convert::
          into<enum_class_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("result == enumeration::alpha",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0x5d,"void enum_class_suite::to_enum()",eVar1 == alpha);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void to_enum()
{
    variable input = static_cast<underlying_type>(enumeration::alpha);
    auto result = convert::into<enumeration>(input);
    TRIAL_PROTOCOL_TEST(result == enumeration::alpha);
}